

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBOCache.cpp
# Opt level: O0

GLFrameBufferObj * __thiscall
Diligent::FBOCache::GetFBO
          (FBOCache *this,TextureBaseGL *pTex,Uint32 ArraySlice,Uint32 MipLevel,
          FRAMEBUFFER_TARGET_FLAGS Targets)

{
  PFNGLBINDFRAMEBUFFERPROC p_Var1;
  bool bVar2;
  FRAMEBUFFER_TARGET_FLAGS FVar3;
  GLuint GVar4;
  GLenum GVar5;
  Char *pCVar6;
  _Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>
  _Var7;
  pointer ppVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>,_bool>
  pVar9;
  undefined1 local_2e0 [8];
  string msg_3;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>,_bool>
  it_inserted;
  string msg_2;
  Char *StatusString;
  undefined1 local_270 [4];
  GLenum Status;
  string msg_1;
  undefined1 local_248 [4];
  GLenum err_1;
  string msg;
  GLFBOCreateReleaseHelper local_220;
  GLenum err;
  GLFrameBufferObj NewFBO;
  _Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
  local_1f0;
  iterator fbo_it;
  SpinLockGuard CacheGuard;
  TextureViewDesc *RTV0;
  FBOCacheKey Key;
  TextureDesc *TexDesc;
  FRAMEBUFFER_TARGET_FLAGS Targets_local;
  Uint32 MipLevel_local;
  Uint32 ArraySlice_local;
  TextureBaseGL *pTex_local;
  FBOCache *this_local;
  
  Key.Hash = (**(code **)((long)(pTex->super_TextureBase<Diligent::EngineGLImplTraits>).
                                super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                .super_ObjectBase<Diligent::ITextureGL>.
                                super_RefCountedObject<Diligent::ITextureGL>.super_ITextureGL.
                                super_ITexture.super_IDeviceObject + 0x20))();
  FBOCacheKey::FBOCacheKey((FBOCacheKey *)&RTV0);
  RTV0._0_4_ = 1;
  RTV0._4_4_ = DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               ::GetUniqueID((DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                              *)pTex);
  Key.RTVDescs[0].super_DeviceObjectAttribs.Name._2_2_ = *(undefined2 *)(Key.Hash + 0x18);
  Key.RTVDescs[0].super_DeviceObjectAttribs.Name._1_1_ = *(undefined1 *)(Key.Hash + 8);
  FVar3 = Diligent::operator&(Targets,FRAMEBUFFER_TARGET_FLAG_DRAW);
  Key.RTVDescs[0].super_DeviceObjectAttribs.Name._0_1_ =
       '\x02' - (FVar3 == FRAMEBUFFER_TARGET_FLAG_NONE);
  Key.RTVDescs[0].NumMipLevels = 1;
  Key.RTVDescs[0].super_DeviceObjectAttribs.Name._4_4_ = MipLevel;
  Key.RTVDescs[0].MostDetailedMip = ArraySlice;
  std::lock_guard<Threading::SpinLock>::lock_guard
            ((lock_guard<Threading::SpinLock> *)&fbo_it,&this->m_CacheLock);
  local_1f0._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj,_Diligent::FBOCache::FBOCacheKeyHashFunc,_std::equal_to<Diligent::FBOCache::FBOCacheKey>,_std::allocator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>_>_>
       ::find(&this->m_Cache,(FBOCacheKey *)&RTV0);
  NewFBO._12_8_ =
       std::
       unordered_map<Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj,_Diligent::FBOCache::FBOCacheKeyHashFunc,_std::equal_to<Diligent::FBOCache::FBOCacheKey>,_std::allocator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>_>_>
       ::end(&this->m_Cache);
  bVar2 = std::__detail::operator==
                    (&local_1f0,
                     (_Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
                      *)&NewFBO.m_NumDrawBuffers);
  if (bVar2) {
    GLObjectWrappers::GLFBOCreateReleaseHelper::GLFBOCreateReleaseHelper(&local_220,0);
    GLObjectWrappers::GLFrameBufferObj::GLFrameBufferObj((GLFrameBufferObj *)&err,true,local_220);
    FVar3 = Diligent::operator&(Targets,FRAMEBUFFER_TARGET_FLAG_READ);
    p_Var1 = __glewBindFramebuffer;
    if (FVar3 != FRAMEBUFFER_TARGET_FLAG_NONE) {
      GVar4 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)&err);
      (*p_Var1)(0x8ca8,GVar4);
      msg.field_2._12_4_ = glGetError();
      if (msg.field_2._12_4_ != 0) {
        LogError<false,char[43],char[17],unsigned_int>
                  (false,"GetFBO",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                   ,0x171,(char (*) [43])"Failed to bind new FBO as read framebuffer",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)local_248,(char (*) [6])0xe8e72e);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"GetFBO",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                   ,0x171);
        std::__cxx11::string::~string((string *)local_248);
      }
    }
    FVar3 = Diligent::operator&(Targets,FRAMEBUFFER_TARGET_FLAG_DRAW);
    p_Var1 = __glewBindFramebuffer;
    if (FVar3 != FRAMEBUFFER_TARGET_FLAG_NONE) {
      GVar4 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)&err);
      (*p_Var1)(0x8ca9,GVar4);
      msg_1.field_2._12_4_ = glGetError();
      if (msg_1.field_2._12_4_ != 0) {
        LogError<false,char[43],char[17],unsigned_int>
                  (false,"GetFBO",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                   ,0x176,(char (*) [43])"Failed to bind new FBO as draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)local_270,(char (*) [6])0xe8e72e);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"GetFBO",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                   ,0x176);
        std::__cxx11::string::~string((string *)local_270);
      }
    }
    GVar5 = GetFramebufferAttachmentPoint(*(TEXTURE_FORMAT *)(Key.Hash + 0x18));
    (**(code **)((long)(pTex->super_TextureBase<Diligent::EngineGLImplTraits>).
                       super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                       .super_ObjectBase<Diligent::ITextureGL>.
                       super_RefCountedObject<Diligent::ITextureGL>.super_ITextureGL.super_ITexture.
                       super_IDeviceObject + 0x98))(pTex,Key.RTIds + 7,GVar5,Targets);
    GVar5 = (*__glewCheckFramebufferStatus)(0x8ca8);
    if (GVar5 != 0x8cd5) {
      msg_2.field_2._8_8_ = GetFramebufferStatusString(GVar5);
      LogError<false,char[44],char_const*>
                (false,"GetFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                 ,0x180,(char (*) [44])"Read framebuffer is incomplete. FB status: ",
                 (char **)((long)&msg_2.field_2 + 8));
      FormatString<char[31]>
                ((string *)&it_inserted.second,(char (*) [31])"Read framebuffer is incomplete");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"GetFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                 ,0x181);
      std::__cxx11::string::~string((string *)&it_inserted.second);
    }
    pVar9 = std::
            unordered_map<Diligent::FBOCache::FBOCacheKey,GLObjectWrappers::GLFrameBufferObj,Diligent::FBOCache::FBOCacheKeyHashFunc,std::equal_to<Diligent::FBOCache::FBOCacheKey>,std::allocator<std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>>>
            ::emplace<Diligent::FBOCache::FBOCacheKey&,GLObjectWrappers::GLFrameBufferObj>
                      ((unordered_map<Diligent::FBOCache::FBOCacheKey,GLObjectWrappers::GLFrameBufferObj,Diligent::FBOCache::FBOCacheKeyHashFunc,std::equal_to<Diligent::FBOCache::FBOCacheKey>,std::allocator<std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>>>
                        *)&this->m_Cache,(FBOCacheKey *)&RTV0,(GLFrameBufferObj *)&err);
    _Var7 = pVar9.first.
            super__Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
            ._M_cur;
    it_inserted.first.
    super__Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
    ._M_cur._0_1_ = pVar9.second;
    msg_3.field_2._8_8_ =
         _Var7.
         super__Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
         ._M_cur;
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[25]>((string *)local_2e0,(char (*) [25])"New FBO was not inserted");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"GetFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                 ,0x187);
      std::__cxx11::string::~string((string *)local_2e0);
    }
    std::
    unordered_multimap<int,Diligent::FBOCache::FBOCacheKey,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,Diligent::FBOCache::FBOCacheKey>>>
    ::emplace<int&,Diligent::FBOCache::FBOCacheKey&>
              ((unordered_multimap<int,Diligent::FBOCache::FBOCacheKey,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,Diligent::FBOCache::FBOCacheKey>>>
                *)&this->m_TexIdToKey,(int *)((long)&RTV0 + 4),(FBOCacheKey *)&RTV0);
    local_1f0 = _Var7.
                super__Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
                ._M_cur;
    GLObjectWrappers::GLFrameBufferObj::~GLFrameBufferObj((GLFrameBufferObj *)&err);
  }
  ppVar8 = std::__detail::
           _Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>
                         *)&local_1f0);
  std::lock_guard<Threading::SpinLock>::~lock_guard((lock_guard<Threading::SpinLock> *)&fbo_it);
  return &ppVar8->second;
}

Assistant:

const GLObjectWrappers::GLFrameBufferObj& FBOCache::GetFBO(TextureBaseGL*                          pTex,
                                                           Uint32                                  ArraySlice,
                                                           Uint32                                  MipLevel,
                                                           TextureBaseGL::FRAMEBUFFER_TARGET_FLAGS Targets)
{
    const TextureDesc& TexDesc = pTex->GetDesc();

    FBOCacheKey Key;
    Key.NumRenderTargets = 1;
    Key.RTIds[0]         = pTex->GetUniqueID();

    TextureViewDesc& RTV0{Key.RTVDescs[0]};
    RTV0.Format     = TexDesc.Format;
    RTV0.TextureDim = TexDesc.Type;
    RTV0.ViewType   = (Targets & TextureBaseGL::FRAMEBUFFER_TARGET_FLAG_DRAW) ?
        TEXTURE_VIEW_RENDER_TARGET : // Also OK for depth attachments
        TEXTURE_VIEW_SHADER_RESOURCE;

    RTV0.FirstArraySlice = ArraySlice;
    RTV0.MostDetailedMip = MipLevel;
    RTV0.NumArraySlices  = 1;

    // Lock the cache
    Threading::SpinLockGuard CacheGuard{m_CacheLock};

    // Try to find FBO in the map
    auto fbo_it = m_Cache.find(Key);
    if (fbo_it == m_Cache.end())
    {
        // Create a new FBO
        GLObjectWrappers::GLFrameBufferObj NewFBO{true};

        if (Targets & TextureBaseGL::FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glBindFramebuffer(GL_READ_FRAMEBUFFER, NewFBO);
            DEV_CHECK_GL_ERROR("Failed to bind new FBO as read framebuffer");
        }
        if (Targets & TextureBaseGL::FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            glBindFramebuffer(GL_DRAW_FRAMEBUFFER, NewFBO);
            DEV_CHECK_GL_ERROR("Failed to bind new FBO as draw framebuffer");
        }

        pTex->AttachToFramebuffer(RTV0, GetFramebufferAttachmentPoint(TexDesc.Format), Targets);

#ifdef DILIGENT_DEVELOPMENT
        GLenum Status = glCheckFramebufferStatus(GL_READ_FRAMEBUFFER);
        if (Status != GL_FRAMEBUFFER_COMPLETE)
        {
            const Char* StatusString = GetFramebufferStatusString(Status);
            LOG_ERROR("Read framebuffer is incomplete. FB status: ", StatusString);
            UNEXPECTED("Read framebuffer is incomplete");
        }
#endif

        auto it_inserted = m_Cache.emplace(Key, std::move(NewFBO));
        // New FBO must be actually inserted
        VERIFY(it_inserted.second, "New FBO was not inserted");
        m_TexIdToKey.emplace(Key.RTIds[0], Key);

        fbo_it = it_inserted.first;
    }
    return fbo_it->second;
}